

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_csupport.cpp
# Opt level: O0

size_t ompc_capture_affinity(char *buffer,size_t buf_size,char *format)

{
  size_t sVar1;
  kmp_str_buf_t *in_RSI;
  char *in_RDI;
  kmp_str_buf_t capture_buf;
  size_t num_required;
  int gtid;
  undefined1 *src_size;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  undefined7 in_stack_fffffffffffffdd9;
  char *in_stack_fffffffffffffde0;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  __kmp_get_global_thread_id();
  src_size = &stack0xfffffffffffffdd8;
  uVar2 = 0x200;
  uVar3 = 0;
  uVar4 = 0;
  sVar1 = __kmp_aux_capture_affinity(capture_buf.str._4_4_,in_RDI,in_RSI);
  if ((in_RDI != (char *)0x0) && (in_RSI != (kmp_str_buf_t *)0x0)) {
    __kmp_strncpy_truncate
              (in_stack_fffffffffffffde0,CONCAT71(in_stack_fffffffffffffdd9,uVar4),
               (char *)CONCAT44(uVar3,uVar2),(size_t)src_size);
  }
  __kmp_str_buf_free((kmp_str_buf_t *)0x12fede);
  return sVar1;
}

Assistant:

size_t ompc_capture_affinity(char *buffer, size_t buf_size,
                             char const *format) {
  int gtid;
  size_t num_required;
  kmp_str_buf_t capture_buf;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  gtid = __kmp_get_gtid();
  __kmp_str_buf_init(&capture_buf);
  num_required = __kmp_aux_capture_affinity(gtid, format, &capture_buf);
  if (buffer && buf_size) {
    __kmp_strncpy_truncate(buffer, buf_size, capture_buf.str,
                           capture_buf.used + 1);
  }
  __kmp_str_buf_free(&capture_buf);
  return num_required;
}